

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

bool __thiscall
PSEngine::does_move_info_matches_rule
          (PSEngine *this,ObjectMoveType p_move_type,EntityRuleInfo p_rule_info,
          AbsoluteDirection p_rule_dir)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  undefined4 in_register_00000034;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
  move_types_opt;
  set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
  allowed_move_types;
  optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
  local_80;
  _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
  local_48;
  
  bVar7 = true;
  if (p_rule_info != None) {
    if (p_rule_info == No) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                    ,0x1d0,
                    "bool PSEngine::does_move_info_matches_rule(ObjectMoveType, CompiledGame::EntityRuleInfo, AbsoluteDirection)"
                   );
    }
    convert_entity_rule_info_to_allowed_move_types
              (&local_80,(PSEngine *)CONCAT44(in_register_00000034,p_move_type),p_rule_info,
               p_rule_dir);
    if (local_80.
        super__Optional_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
        ._M_engaged != true) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                    ,0x1e7,
                    "bool PSEngine::does_move_info_matches_rule(ObjectMoveType, CompiledGame::EntityRuleInfo, AbsoluteDirection)"
                   );
    }
    std::
    _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
    ::_Rb_tree(&local_48,
               (_Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
                *)&local_80);
    if (local_48._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar7 = p_move_type == Stationary;
    }
    else {
      p_Var1 = &local_48._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      p_Var6 = &p_Var1->_M_header;
      if (local_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var3 = local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var4 = p_Var5;
          _Var2 = p_Var3[1]._M_color;
          p_Var5 = p_Var3;
          if ((int)_Var2 < (int)p_move_type) {
            p_Var5 = p_Var4;
          }
          local_48._M_impl.super__Rb_tree_header._M_header._M_parent =
               (&p_Var3->_M_left)[(int)_Var2 < (int)p_move_type];
        } while ((&p_Var3->_M_left)[(int)_Var2 < (int)p_move_type] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var5 != p_Var1) {
          if ((int)_Var2 < (int)p_move_type) {
            p_Var3 = p_Var4;
          }
          p_Var6 = p_Var5;
          if ((int)p_move_type < (int)p_Var3[1]._M_color) {
            p_Var6 = &p_Var1->_M_header;
          }
        }
      }
      bVar7 = (_Rb_tree_header *)p_Var6 != p_Var1;
    }
    std::
    _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
    ::~_Rb_tree(&local_48);
    if (local_80.
        super__Optional_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
        ._M_engaged == true) {
      local_80.
      super__Optional_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
      ._M_engaged = false;
      std::
      _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
      ::~_Rb_tree((_Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
                   *)&local_80);
    }
  }
  return bVar7;
}

Assistant:

bool PSEngine::does_move_info_matches_rule(ObjectMoveType p_move_type, CompiledGame::EntityRuleInfo p_rule_info, AbsoluteDirection p_rule_dir)
{
    if(p_rule_info == CompiledGame::EntityRuleInfo::None)
    {
        return true;
    }
    else if( p_rule_info == CompiledGame::EntityRuleInfo::No)
    {
        assert(false);
        PS_LOG_ERROR("should not happen");
        return false;
    }
    else
    {
        optional<set<ObjectMoveType>> move_types_opt = convert_entity_rule_info_to_allowed_move_types(p_rule_info,p_rule_dir);

        if(move_types_opt.has_value())
        {
            set<PSEngine::ObjectMoveType>allowed_move_types = move_types_opt.value();

            if(allowed_move_types.size() == 0)
            {
                return p_move_type == PSEngine::ObjectMoveType::Stationary;
            }
            else
            {
                return allowed_move_types.find(p_move_type) != allowed_move_types.end();
            }
        }
        else
        {
            assert(false);
            PS_LOG_ERROR("should not happen");
            return false;
        }
    }
}